

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void ec_pubkey_parse_pointtest(uchar *input,int xvalid,int yvalid)

{
  int iVar1;
  long lVar2;
  secp256k1_context *extraout_RAX;
  secp256k1_context *psVar3;
  size_t sVar4;
  uint uVar5;
  byte bVar6;
  uchar *puVar7;
  uint uVar8;
  bool bVar9;
  int32_t ecount;
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_result;
  size_t outl;
  unsigned_long _zzq_args [6];
  uchar pubkeyc [65];
  secp256k1_ge ge;
  int local_1d4 [5];
  secp256k1_ge_storage *local_1c0;
  size_t local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  size_t local_198;
  int local_18c;
  uchar local_188 [8];
  secp256k1_ge_storage *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  size_t local_138;
  int local_130;
  uint local_12c;
  uchar *local_128;
  ulong local_120;
  secp256k1_ge_storage local_118;
  uchar local_d8;
  undefined8 local_d7;
  undefined8 uStack_cf;
  undefined8 local_c7;
  undefined8 uStack_bf;
  undefined8 local_b7;
  undefined8 uStack_af;
  undefined8 local_a7;
  undefined8 uStack_9f;
  secp256k1_ge local_88;
  
  psVar3 = CTX;
  local_1d4[0] = 0;
  local_18c = xvalid;
  local_130 = yvalid;
  if (secp256k1_context_static == CTX) goto LAB_00166d6a;
  (CTX->illegal_callback).fn = counting_illegal_callback_fn;
  (psVar3->illegal_callback).data = local_1d4;
  do {
    sVar4 = 3;
    local_128 = input;
LAB_00166645:
    bVar9 = local_18c != 0;
    local_d7 = *(undefined8 *)input;
    uStack_cf = *(undefined8 *)(input + 8);
    local_c7 = *(undefined8 *)(input + 0x10);
    uStack_bf = *(undefined8 *)(input + 0x18);
    local_b7 = *(undefined8 *)(input + 0x20);
    uStack_af = *(undefined8 *)(input + 0x28);
    local_a7 = *(undefined8 *)(input + 0x30);
    uStack_9f = *(undefined8 *)(input + 0x38);
    local_12c = (uint)(sVar4 == 0x41) * 4;
    local_120 = (ulong)(sVar4 == 0x41 || sVar4 == 0x21);
    uVar5 = 0;
    local_138 = sVar4;
    while( true ) {
      local_d8 = (uchar)uVar5;
      uVar8 = input[0x3f] & 1 | 2;
      if ((local_18c == 0 || local_130 == 0) || (uVar5 & 4) != local_12c) {
        bVar6 = 0;
      }
      else {
        bVar6 = ((uVar5 & 0xfb) == uVar8 || uVar5 == 4) & (byte)local_120;
      }
      if ((((bVar9 && sVar4 == 0x21) && (uVar5 & 0xfe) == 2) | bVar6) == 1) break;
      local_118.y.n[2] = 0xfefefefefefefefe;
      local_118.y.n[3] = 0xfefefefefefefefe;
      local_118.y.n[0] = 0xfefefefefefefefe;
      local_118.y.n[1] = 0xfefefefefefefefe;
      local_118.x.n[2] = 0xfefefefefefefefe;
      local_118.x.n[3] = 0xfefefefefefefefe;
      local_118.x.n[0] = 0xfefefefefefefefe;
      local_118.x.n[1] = 0xfefefefefefefefe;
      local_1d4[0] = 0;
      local_188[0] = '\x01';
      local_188[1] = '\0';
      local_188[2] = 'C';
      local_188[3] = 'M';
      local_188[4] = '\0';
      local_188[5] = '\0';
      local_188[6] = '\0';
      local_188[7] = '\0';
      local_178 = 0x40;
      local_170 = 0;
      local_168 = 0;
      local_160 = 0;
      local_1d4[3] = 0;
      local_1d4[4] = 0;
      local_180 = &local_118;
      iVar1 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)&local_118,&local_d8,local_138);
      if (iVar1 != 0) {
LAB_00166d1f:
        ec_pubkey_parse_pointtest_cold_1();
        puVar7 = input;
LAB_00166d24:
        ec_pubkey_parse_pointtest_cold_2();
LAB_00166d29:
        ec_pubkey_parse_pointtest_cold_15();
LAB_00166d2e:
        ec_pubkey_parse_pointtest_cold_3();
LAB_00166d33:
        ec_pubkey_parse_pointtest_cold_5();
        input = puVar7;
LAB_00166d38:
        ec_pubkey_parse_pointtest_cold_4();
LAB_00166d3d:
        ec_pubkey_parse_pointtest_cold_14();
LAB_00166d42:
        ec_pubkey_parse_pointtest_cold_11();
LAB_00166d47:
        ec_pubkey_parse_pointtest_cold_7();
LAB_00166d4c:
        ec_pubkey_parse_pointtest_cold_13();
LAB_00166d51:
        ec_pubkey_parse_pointtest_cold_12();
LAB_00166d56:
        ec_pubkey_parse_pointtest_cold_8();
        goto LAB_00166d5b;
      }
      local_188[0] = '\x05';
      local_188[1] = '\0';
      local_188[2] = 'C';
      local_188[3] = 'M';
      local_188[4] = '\0';
      local_188[5] = '\0';
      local_188[6] = '\0';
      local_188[7] = '\0';
      local_178 = 0x40;
      local_170 = 0;
      local_168 = 0;
      local_160 = 0;
      local_1d4[3] = 0;
      local_1d4[4] = 0;
      puVar7 = input;
      local_180 = &local_118;
      if (local_1d4[0] != 0) goto LAB_00166d24;
      iVar1 = secp256k1_pubkey_load(CTX,&local_88,(secp256k1_pubkey *)&local_118);
      if (iVar1 != 0) goto LAB_00166d2e;
      if (local_1d4[0] != 1) goto LAB_00166d38;
LAB_00166cc0:
      psVar3 = CTX;
      uVar5 = uVar5 + 1;
      if (uVar5 == 0x100) goto code_r0x00166cce;
    }
    local_118.x.n[0] = 0;
    local_118.x.n[1] = 0;
    local_118.x.n[2] = 0;
    local_118.x.n[3] = 0;
    local_118.y.n[0] = 0;
    local_118.y.n[1] = 0;
    local_118.y.n[2] = 0;
    local_118.y.n[3] = 0;
    local_188[0] = '\x01';
    local_188[1] = '\0';
    local_188[2] = 'C';
    local_188[3] = 'M';
    local_188[4] = '\0';
    local_188[5] = '\0';
    local_188[6] = '\0';
    local_188[7] = '\0';
    puVar7 = (uchar *)0x0;
    local_178 = 0x40;
    local_170 = 0;
    local_168 = 0;
    local_160 = 0;
    local_1d4[3] = 0;
    local_1d4[4] = 0;
    local_1d4[0] = 0;
    local_180 = &local_118;
    iVar1 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)&local_118,&local_d8,local_138);
    if (iVar1 == 0) {
      ec_pubkey_parse_pointtest_cold_16();
      input = puVar7;
      goto LAB_00166d1f;
    }
    local_188[0] = '\x05';
    local_188[1] = '\0';
    local_188[2] = 'C';
    local_188[3] = 'M';
    local_188[4] = '\0';
    local_188[5] = '\0';
    local_188[6] = '\0';
    local_188[7] = '\0';
    local_178 = 0x40;
    local_170 = 0;
    local_168 = 0;
    local_160 = 0;
    local_198 = 0x41;
    local_1d4[3] = 0x4d430001;
    local_1d4[4] = 0;
    local_1b8 = 0x41;
    local_1b0 = 0;
    local_1a8 = 0;
    local_1a0 = 0;
    local_1d4[1] = 0;
    local_1d4[2] = 0;
    local_1c0 = (secp256k1_ge_storage *)local_188;
    local_180 = &local_118;
    iVar1 = secp256k1_ec_pubkey_serialize
                      (CTX,local_188,&local_198,(secp256k1_pubkey *)&local_118,0x102);
    input = local_128;
    if (iVar1 == 0) goto LAB_00166d29;
    local_1d4[3] = 0x4d430005;
    local_1d4[4] = 0;
    local_1b8 = local_198;
    local_1b0 = 0;
    local_1a8 = 0;
    local_1a0 = 0;
    local_1d4[1] = 0;
    local_1d4[2] = 0;
    local_1c0 = (secp256k1_ge_storage *)local_188;
    if (local_198 != 0x21) goto LAB_00166d33;
    lVar2 = 1;
    do {
      if (local_188[lVar2] != (&local_d8)[lVar2]) goto LAB_00166d60;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x21);
    if ((local_138 == 0x21) && (local_188[0] != local_d8)) goto LAB_00166d3d;
    if (bVar6 == 0) {
LAB_00166b8c:
      local_1c0 = (secp256k1_ge_storage *)local_188;
      local_1a0 = 0;
      local_1a8 = 0;
      local_1b0 = 0;
      local_1d4[3] = 0x4d430005;
      local_1d4[4] = 0;
      local_1d4[1] = 0;
      local_1d4[2] = 0;
      local_1b8 = local_198;
      if (local_1d4[0] == 0) goto LAB_00166cc0;
      goto LAB_00166d42;
    }
    if (local_188[0] != (uchar)uVar8) goto LAB_00166d47;
    iVar1 = secp256k1_pubkey_load(CTX,&local_88,(secp256k1_pubkey *)&local_118);
    if (iVar1 == 0) goto LAB_00166d4c;
    local_118.y.n[2] = 0;
    local_118.y.n[3] = 0;
    local_118.y.n[0] = 0;
    local_118.y.n[1] = 0;
    local_118.x.n[2] = 0;
    local_118.x.n[3] = 0;
    local_118.x.n[0] = 0;
    local_118.x.n[1] = 0;
    local_1d4[3] = 0x4d430001;
    local_1d4[4] = 0;
    local_1b8 = 0x40;
    local_1b0 = 0;
    local_1a8 = 0;
    local_1a0 = 0;
    local_1d4[1] = 0;
    local_1d4[2] = 0;
    local_1c0 = &local_118;
    secp256k1_ge_to_storage(&local_118,&local_88);
    local_198 = 0x41;
    local_1d4[3] = 0x4d430001;
    local_1d4[4] = 0;
    local_1b8 = 0x41;
    local_1b0 = 0;
    local_1a8 = 0;
    local_1a0 = 0;
    local_1d4[1] = 0;
    local_1d4[2] = 0;
    local_1c0 = (secp256k1_ge_storage *)local_188;
    iVar1 = secp256k1_ec_pubkey_serialize(CTX,local_188,&local_198,(secp256k1_pubkey *)&local_118,2)
    ;
    if (iVar1 == 0) goto LAB_00166d51;
    local_1d4[3] = 0x4d430005;
    local_1d4[4] = 0;
    local_1b8 = local_198;
    local_1b0 = 0;
    local_1a8 = 0;
    local_1a0 = 0;
    local_1d4[1] = 0;
    local_1d4[2] = 0;
    local_1c0 = (secp256k1_ge_storage *)local_188;
    if (local_198 != 0x41) goto LAB_00166d56;
    if (local_188[0] == '\x04') {
      lVar2 = 0;
      do {
        if (local_188[lVar2 + 1] != input[lVar2]) goto LAB_00166d65;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x40);
      goto LAB_00166b8c;
    }
LAB_00166d5b:
    ec_pubkey_parse_pointtest_cold_9();
LAB_00166d60:
    ec_pubkey_parse_pointtest_cold_6();
LAB_00166d65:
    ec_pubkey_parse_pointtest_cold_10();
    psVar3 = extraout_RAX;
LAB_00166d6a:
    (*(psVar3->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar3->illegal_callback).data);
  } while( true );
code_r0x00166cce:
  sVar4 = local_138 + 1;
  if (sVar4 == 0x42) {
    if (secp256k1_context_static == CTX) {
      (*(CTX->illegal_callback).fn)("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
    }
    else {
      (CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
      (psVar3->illegal_callback).data = (void *)0x0;
    }
    return;
  }
  goto LAB_00166645;
}

Assistant:

static void ec_pubkey_parse_pointtest(const unsigned char *input, int xvalid, int yvalid) {
    unsigned char pubkeyc[65];
    secp256k1_pubkey pubkey;
    secp256k1_ge ge;
    size_t pubkeyclen;
    int32_t ecount;
    ecount = 0;
    secp256k1_context_set_illegal_callback(CTX, counting_illegal_callback_fn, &ecount);
    for (pubkeyclen = 3; pubkeyclen <= 65; pubkeyclen++) {
        /* Smaller sizes are tested exhaustively elsewhere. */
        int32_t i;
        memcpy(&pubkeyc[1], input, 64);
        SECP256K1_CHECKMEM_UNDEFINE(&pubkeyc[pubkeyclen], 65 - pubkeyclen);
        for (i = 0; i < 256; i++) {
            /* Try all type bytes. */
            int xpass;
            int ypass;
            int ysign;
            pubkeyc[0] = i;
            /* What sign does this point have? */
            ysign = (input[63] & 1) + 2;
            /* For the current type (i) do we expect parsing to work? Handled all of compressed/uncompressed/hybrid. */
            xpass = xvalid && (pubkeyclen == 33) && ((i & 254) == 2);
            /* Do we expect a parse and re-serialize as uncompressed to give a matching y? */
            ypass = xvalid && yvalid && ((i & 4) == ((pubkeyclen == 65) << 2)) &&
                ((i == 4) || ((i & 251) == ysign)) && ((pubkeyclen == 33) || (pubkeyclen == 65));
            if (xpass || ypass) {
                /* These cases must parse. */
                unsigned char pubkeyo[65];
                size_t outl;
                memset(&pubkey, 0, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                ecount = 0;
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                outl = 65;
                SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
                SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                CHECK(outl == 33);
                CHECK(secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0);
                CHECK((pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0]));
                if (ypass) {
                    /* This test isn't always done because we decode with alternative signs, so the y won't match. */
                    CHECK(pubkeyo[0] == ysign);
                    CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1);
                    memset(&pubkey, 0, sizeof(pubkey));
                    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                    secp256k1_pubkey_save(&pubkey, &ge);
                    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                    outl = 65;
                    SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1);
                    SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                    CHECK(outl == 65);
                    CHECK(pubkeyo[0] == 4);
                    CHECK(secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0);
                }
                CHECK(ecount == 0);
            } else {
                /* These cases must fail to parse. */
                memset(&pubkey, 0xfe, sizeof(pubkey));
                ecount = 0;
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                CHECK(ecount == 0);
                CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 0);
                CHECK(ecount == 1);
            }
        }
    }
    secp256k1_context_set_illegal_callback(CTX, NULL, NULL);
}